

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.cpp
# Opt level: O2

void __thiscall List<Command_*>::RemoveAt(List<Command_*> *this,long index)

{
  long lVar1;
  
  lVar1 = *(long *)(this + 0x10);
  if (index < 0 || lVar1 <= index) {
    std::operator<<((ostream *)&std::cout,"Throw RangeException\n");
    lVar1 = *(long *)(this + 0x10);
  }
  for (; index < lVar1 + -1; index = index + 1) {
    *(undefined8 *)(*(long *)this + index * 8) = *(undefined8 *)(*(long *)this + 8 + index * 8);
  }
  *(long *)(this + 0x10) = lVar1 + -1;
  return;
}

Assistant:

void List<Item>::RemoveAt(long index) {
    if (index < 0 || index >= Count())
        std::cout << "Throw RangeException\n";
    for (long i = index; i < Count()-1; i++)
        _items[i] = _items[i+1];
    _count--;
}